

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O2

int __thiscall cmCTestScriptHandler::RunCurrentScript(cmCTestScriptHandler *this)

{
  double dVar1;
  int iVar2;
  uint __seconds;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  cmList envArgs;
  
  this->ShouldRunCurrentScript = false;
  cmSystemTools::s_RunCommandHideConsole = true;
  iVar2 = ExtractVariables(this);
  if (iVar2 == 0) {
    if ((this->CTestEnv)._M_string_length != 0) {
      std::__cxx11::string::string((string *)&local_58,(string *)&this->CTestEnv);
      init._M_len = 1;
      init._M_array = &local_58;
      cmList::cmList(&envArgs,init);
      std::__cxx11::string::~string((string *)&local_58);
      cmSystemTools::AppendEnv(&envArgs.Values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&envArgs.Values);
    }
    if (0.0 <= this->ContinuousDuration) {
      UpdateElapsedTime(this);
      lVar3 = std::chrono::_V2::steady_clock::now();
      dVar1 = this->ContinuousDuration;
      if (this->EmptyBinDirOnce == true) {
        this->EmptyBinDir = true;
      }
      do {
        lVar4 = std::chrono::_V2::steady_clock::now();
        iVar2 = RunConfigurationDashboard(this);
        lVar5 = std::chrono::_V2::steady_clock::now();
        dVar6 = this->MinimumInterval * 1000000000.0;
        if ((double)(lVar5 - lVar4) < dVar6) {
          local_58._M_dataplus._M_p = (pointer)((dVar6 - (double)(lVar5 - lVar4)) / 1000000000.0);
          __seconds = cmDurationTo<unsigned_int>((cmDuration *)&local_58);
          sleep(__seconds);
        }
        if (this->EmptyBinDirOnce == true) {
          this->EmptyBinDir = false;
        }
        lVar4 = std::chrono::_V2::steady_clock::now();
      } while ((double)lVar4 < dVar1 * 1000000000.0 + (double)lVar3);
    }
    else {
      iVar2 = RunConfigurationDashboard(this);
    }
  }
  return iVar2;
}

Assistant:

int cmCTestScriptHandler::RunCurrentScript()
{
  int result;

  // do not run twice
  this->SetRunCurrentScript(false);

  // no popup widows
  cmSystemTools::SetRunCommandHideConsole(true);

  // extract the vars from the cache and store in ivars
  result = this->ExtractVariables();
  if (result) {
    return result;
  }

  // set any environment variables
  if (!this->CTestEnv.empty()) {
    cmList envArgs{ this->CTestEnv };
    cmSystemTools::AppendEnv(envArgs);
  }

  // now that we have done most of the error checking finally run the
  // dashboard, we may be asked to repeatedly run this dashboard, such as
  // for a continuous, do we need to run it more than once?
  if (this->ContinuousDuration >= 0) {
    this->UpdateElapsedTime();
    auto ending_time =
      std::chrono::steady_clock::now() + cmDuration(this->ContinuousDuration);
    if (this->EmptyBinDirOnce) {
      this->EmptyBinDir = true;
    }
    do {
      auto startOfInterval = std::chrono::steady_clock::now();
      result = this->RunConfigurationDashboard();
      auto interval = std::chrono::steady_clock::now() - startOfInterval;
      auto minimumInterval = cmDuration(this->MinimumInterval);
      if (interval < minimumInterval) {
        auto sleepTime =
          cmDurationTo<unsigned int>(minimumInterval - interval);
        this->SleepInSeconds(sleepTime);
      }
      if (this->EmptyBinDirOnce) {
        this->EmptyBinDir = false;
      }
    } while (std::chrono::steady_clock::now() < ending_time);
  }
  // otherwise just run it once
  else {
    result = this->RunConfigurationDashboard();
  }

  return result;
}